

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_parser.cc
# Opt level: O1

void __thiscall
xsettingsd::ConfigParser::FileCharStream::FileCharStream(FileCharStream *this,string *filename)

{
  pointer pcVar1;
  
  (this->super_CharStream).initialized_ = false;
  (this->super_CharStream).have_buffered_char_ = false;
  (this->super_CharStream).buffered_char_ = 0;
  (this->super_CharStream).at_line_end_ = true;
  (this->super_CharStream).prev_at_line_end_ = false;
  (this->super_CharStream).line_num_ = 0;
  (this->super_CharStream)._vptr_CharStream = (_func_int **)&PTR__FileCharStream_0010bbb0;
  (this->filename_)._M_dataplus._M_p = (pointer)&(this->filename_).field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->filename_,pcVar1,pcVar1 + filename->_M_string_length);
  this->file_ = (FILE *)0x0;
  return;
}

Assistant:

ConfigParser::FileCharStream::FileCharStream(const string& filename)
    : filename_(filename),
      file_(NULL) {
}